

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O2

void __thiscall
Omega_h::HostWrite<long>::HostWrite
          (HostWrite<long> *this,LO size_in,long offset,long stride,string *name_in)

{
  Write<long> local_20;
  
  Write<long>::Write(&local_20,size_in,offset,stride,name_in);
  Write<long>::Write((Write<int> *)this,(Write<int> *)&local_20);
  Write<long>::~Write(&local_20);
  return;
}

Assistant:

HostWrite<T>::HostWrite(
    LO size_in, T offset, T stride, std::string const& name_in)
    : HostWrite<T>(Write<T>(size_in, offset, stride, name_in)) {}